

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarSignalFilter(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Ssw_Cla_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Ssw_Cla_t *pSVar8;
  void *pvVar9;
  Abc_Cex_t *pAVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  Aig_Man_t *pAVar16;
  Vec_Ptr_t *pVVar17;
  Ssw_Cla_t *__ptr;
  code *pcVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  timespec ts;
  int local_64;
  timespec local_60;
  long local_50;
  Ssw_Cla_t *local_48;
  int *local_40;
  long local_38;
  
  iVar12 = 3;
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  iVar3 = pPars->TimeOut;
  if ((long)iVar3 == 0) {
    lVar15 = 0;
  }
  else {
    iVar12 = 3;
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar15 = lVar15 + (long)iVar3 * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x4cc,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nConstrs != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x4cd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  iVar3 = -1;
  if (pAig->nObjs[6] + pAig->nObjs[5] != 0) {
    uVar11 = pPars->nRandSeed;
    if (pPars->fMiter != 0) {
      pAVar16 = pAig;
      iVar3 = Ssw_RarCheckTrivial(pAig,1);
      iVar12 = (int)pAVar16;
      if (iVar3 != 0) {
        return 0;
      }
    }
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar12,
                "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n"
                ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,(ulong)(uint)pPars->nRounds,
                (ulong)(uint)pPars->nRandSeed,pPars->TimeOut);
    }
    local_48 = (Ssw_Cla_t *)(ulong)uVar11;
    local_38 = lVar15;
    Ssw_RarManPrepareRandom(uVar11);
    p = (Ssw_Cla_t *)Ssw_RarManStart(pAig,pPars);
    lVar15._0_4_ = p->nCands1;
    lVar15._4_4_ = p->nLits;
    if (lVar15 != 0) {
      __assert_fail("p->vInits == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x4dd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    pAVar10 = pPars->pCex;
    iVar3 = pAig->nRegs;
    local_50 = lVar20;
    if (pAVar10 == (Abc_Cex_t *)0x0) {
      piVar7 = (int *)malloc(0x10);
      iVar12 = 0x10;
      if (0xe < iVar3 - 1U) {
        iVar12 = iVar3;
      }
      piVar7[1] = 0;
      *piVar7 = iVar12;
      if (iVar12 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc((long)iVar12 << 2);
      }
      *(void **)(piVar7 + 2) = pvVar9;
      piVar7[1] = iVar3;
      memset(pvVar9,0,(long)iVar3 << 2);
      *(int **)&p->nCands1 = piVar7;
    }
    else {
      if (0 < iVar3) {
        uVar11 = 0;
        do {
          uVar13 = pAig->nTruePos + uVar11;
          if (((int)uVar13 < 0) || (pAig->vCos->nSize <= (int)uVar13)) goto LAB_005ed443;
          pvVar9 = pAig->vCos->pArray[uVar13];
          *(ulong *)((long)pvVar9 + 0x18) =
               *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&pAVar10[1].iPo)[uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) << 5);
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 < pAig->nRegs);
      }
      uVar11 = pAVar10->nRegs;
      if (-1 < pAVar10->iFrame) {
        iVar3 = 0;
        do {
          puVar1 = &pAig->pConst1->field_0x18;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
          if (0 < pAig->nTruePis) {
            lVar20 = 0;
            do {
              if (pAig->vCis->nSize <= lVar20) goto LAB_005ed443;
              pvVar9 = pAig->vCis->pArray[lVar20];
              *(ulong *)((long)pvVar9 + 0x18) =
                   *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf |
                   (ulong)(((uint)(&pAVar10[1].iPo)[(int)((ulong)uVar11 + lVar20) >> 5] >>
                            ((byte)((ulong)uVar11 + lVar20) & 0x1f) & 1) << 5);
              lVar20 = lVar20 + 1;
            } while (lVar20 < pAig->nTruePis);
            uVar11 = uVar11 + (int)lVar20;
          }
          if (0 < pAig->nRegs) {
            iVar12 = 0;
            do {
              uVar13 = pAig->nTruePos + iVar12;
              if (((((int)uVar13 < 0) || (pAig->vCos->nSize <= (int)uVar13)) ||
                  (uVar19 = pAig->nTruePis + iVar12, (int)uVar19 < 0)) ||
                 (pAig->vCis->nSize <= (int)uVar19)) goto LAB_005ed443;
              pvVar9 = pAig->vCis->pArray[uVar19];
              *(ulong *)((long)pvVar9 + 0x18) =
                   *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf |
                   (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar13] + 0x18) & 0x20);
              iVar12 = iVar12 + 1;
            } while (iVar12 < pAig->nRegs);
          }
          pVVar17 = pAig->vObjs;
          if (0 < pVVar17->nSize) {
            lVar20 = 0;
            do {
              pvVar9 = pVVar17->pArray[lVar20];
              if ((pvVar9 != (void *)0x0) &&
                 (0xfffffffd < ((uint)*(ulong *)((long)pvVar9 + 0x18) & 7) - 7)) {
                *(ulong *)((long)pvVar9 + 0x18) =
                     *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf |
                     (ulong)((((uint)*(ulong *)((long)pvVar9 + 0x10) ^
                              *(uint *)((*(ulong *)((long)pvVar9 + 0x10) & 0xfffffffffffffffe) +
                                       0x18) >> 5) &
                              ((uint)*(ulong *)((long)pvVar9 + 8) ^
                              *(uint *)((*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe) + 0x18)
                              >> 5) & 1) << 5);
              }
              lVar20 = lVar20 + 1;
              pVVar17 = pAig->vObjs;
            } while (lVar20 < pVVar17->nSize);
          }
          pVVar17 = pAig->vCos;
          if (0 < pVVar17->nSize) {
            lVar20 = 0;
            do {
              pvVar9 = pVVar17->pArray[lVar20];
              *(ulong *)((long)pvVar9 + 0x18) =
                   *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf |
                   (ulong)(((int)*(ulong *)((long)pvVar9 + 8) << 5 ^
                           *(uint *)((*(ulong *)((long)pvVar9 + 8) & 0xfffffffffffffffe) + 0x18)) &
                          0x20);
              lVar20 = lVar20 + 1;
              pVVar17 = pAig->vCos;
            } while (lVar20 < pVVar17->nSize);
          }
          bVar2 = iVar3 < pAVar10->iFrame;
          iVar3 = iVar3 + 1;
        } while (bVar2);
      }
      if (uVar11 != pAVar10->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                      ,0x390,"Vec_Int_t *Ssw_RarFindStartingState(Aig_Man_t *, Abc_Cex_t *)");
      }
      iVar3 = pAig->nRegs;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      iVar12 = 0x10;
      if (0xe < iVar3 - 1U) {
        iVar12 = iVar3;
      }
      pVVar6->nSize = 0;
      pVVar6->nCap = iVar12;
      if (iVar12 == 0) {
        piVar7 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc((long)iVar12 << 2);
      }
      pVVar6->pArray = piVar7;
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          uVar11 = pAig->nTruePis + iVar3;
          if (((int)uVar11 < 0) || (pAig->vCis->nSize <= (int)uVar11)) {
LAB_005ed443:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Vec_IntPush(pVVar6,*(uint *)((long)pAig->vCis->pArray[uVar11] + 0x18) >> 5 & 1);
          iVar3 = iVar3 + 1;
        } while (iVar3 < pAig->nRegs);
      }
      pAVar16 = pAig;
      Aig_ManCleanMarkB(pAig);
      *(Vec_Int_t **)&p->nCands1 = pVVar6;
      Abc_Print((int)pAVar16,
                "Beginning simulation from the state derived using the counter-example.\n");
    }
    iVar3 = pPars->nWords;
    if (1 < iVar3) {
      iVar12 = 1;
      do {
        if (0 < pAig->nRegs) {
          lVar20 = 0;
          do {
            pVVar6 = *(Vec_Int_t **)&p->nCands1;
            if (pVVar6->nSize <= lVar20) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(pVVar6,pVVar6->pArray[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 < pAig->nRegs);
        }
        iVar12 = iVar12 + 1;
        iVar3 = pPars->nWords;
      } while (iVar12 < iVar3);
    }
    if (*(int *)(*(long *)&p->nCands1 + 4) != iVar3 * pAig->nRegs) {
      __assert_fail("Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x4e9,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    if (pAig->pReprs == (Aig_Obj_t **)0x0) {
      pSVar8 = Ssw_ClassesPrepareSimple(pAig,pPars->fLatchOnly,0);
    }
    else {
      pSVar8 = Ssw_ClassesPrepareFromReprs(pAig);
    }
    *(Ssw_Cla_t **)&p->fConstCorr = pSVar8;
    pcVar18 = Ssw_RarManObjsAreEqual;
    Ssw_ClassesSetData(pSVar8,p,Ssw_RarManObjHashWord,Ssw_RarManObjIsConst,Ssw_RarManObjsAreEqual);
    if (pPars->fVerbose != 0) {
      Abc_Print((int)pSVar8,"Initial  :  ");
      pSVar8 = *(Ssw_Cla_t **)&p->fConstCorr;
      Ssw_ClassesPrint(pSVar8,0);
    }
    iVar12 = -1;
    uVar11 = 0;
    local_64 = 0;
    while( true ) {
      iVar4 = (int)pSVar8;
      if ((pPars->nRounds != 0) && (pPars->nRounds <= (int)(pPars->nRestart * local_64 + uVar11)))
      break;
      iVar3 = Ssw_ClassesCand1Num(*(Ssw_Cla_t **)&p->fConstCorr);
      if (iVar3 == 0) {
        pSVar8 = *(Ssw_Cla_t **)&p->fConstCorr;
        iVar3 = Ssw_ClassesClassNum(pSVar8);
        iVar4 = (int)pSVar8;
        if (iVar3 == 0) {
          Abc_Print(iVar4,"All equivalences are refined away.\n");
          break;
        }
      }
      if (pPars->nFrames < 1) {
        iVar12 = 0;
      }
      else {
        iVar12 = 0;
        do {
          if (iVar12 == 0) {
            pVVar6 = *(Vec_Int_t **)&p->nCands1;
          }
          else {
            pVVar6 = (Vec_Int_t *)0x0;
          }
          Ssw_RarManSimulate((Ssw_RarMan_t *)p,pVVar6,1,(uint)(iVar12 == 0 && uVar11 == 0));
          if (pPars->fMiter != 0) {
            pSVar8 = p;
            iVar4 = Ssw_RarManCheckNonConstOutputs((Ssw_RarMan_t *)p,-1,0);
            iVar3 = (int)pcVar18;
            iVar5 = (int)pSVar8;
            if (iVar4 != 0) {
              if (pPars->fVerbose == 0) {
                iVar4 = Abc_FrameIsBatchMode();
                pcVar14 = "\n";
                if (iVar4 == 0) {
                  pcVar14 = "\r";
                }
                Abc_Print(iVar5,"%s",pcVar14);
              }
              if (pPars->fVerbose != 0) {
                iVar3 = local_64;
                Abc_Print(iVar5,"Simulated %d frames for %d rounds with %d restarts.\n",
                          (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + uVar11));
              }
              Ssw_RarManPrepareRandom((int)local_48);
              Abc_CexFree(pAig->pSeqModel);
              pSVar8 = p;
              pAVar10 = Ssw_RarDeriveCex((Ssw_RarMan_t *)p,*(int *)&p->pAig->pName * uVar11 + iVar12
                                         ,*(int *)&p->pFuncNodeIsConst,
                                         *(int *)((long)&p->pFuncNodeIsConst + 4),iVar3);
              pAig->pSeqModel = pAVar10;
              iVar3 = 0;
              Abc_Print((int)pSVar8,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                        (ulong)(uint)pAVar10->iPo,pAig->pName,(ulong)(uint)pAVar10->iFrame);
              iVar4 = 3;
              iVar5 = clock_gettime(3,&local_60);
              if (iVar5 < 0) {
                lVar20 = -1;
              }
              else {
                lVar20 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
              }
              lVar20 = lVar20 - local_50;
              Abc_Print(iVar4,"%s =","Time");
              Abc_Print(iVar4,"%9.2f sec\n",(double)lVar20 / 1000000.0);
              goto LAB_005ed330;
            }
          }
          if (pPars->TimeOut != 0) {
            iVar4 = 3;
            iVar3 = clock_gettime(3,&local_60);
            if (iVar3 < 0) {
              lVar20 = -1;
            }
            else {
              lVar20 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
            }
            if (local_38 < lVar20) {
              if (pPars->fVerbose != 0) {
                Abc_Print(iVar4,"\n");
              }
              Abc_Print(iVar4,"Simulated %d frames for %d rounds with %d restarts.  ",
                        (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + uVar11));
              Abc_Print(iVar4,"Reached timeout (%d sec).\n",(ulong)(uint)pPars->TimeOut);
              goto LAB_005ed2ed;
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < pPars->nFrames);
      }
      if ((pPars->pCex == (Abc_Cex_t *)0x0) && (uVar11 == pPars->nRestart && pPars->nRestart != 0))
      {
        uVar11 = ((int)local_48 + 1) % 1000;
        pSVar8 = (Ssw_Cla_t *)(ulong)uVar11;
        local_48 = pSVar8;
        Ssw_RarManPrepareRandom(uVar11);
        local_40 = *(int **)&p->nCands1;
        uVar21 = (long)pPars->nWords * (long)pAig->nRegs;
        iVar3 = (int)uVar21;
        if (*local_40 < iVar3) {
          __ptr = *(Ssw_Cla_t **)(local_40 + 2);
          pSVar8 = (Ssw_Cla_t *)(uVar21 * 4);
          if (__ptr == (Ssw_Cla_t *)0x0) {
            pvVar9 = malloc((size_t)pSVar8);
          }
          else {
            pvVar9 = realloc(__ptr,(size_t)pSVar8);
            pSVar8 = __ptr;
          }
          *(void **)(local_40 + 2) = pvVar9;
          if (pvVar9 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *local_40 = iVar3;
        }
        if (0 < iVar3) {
          pSVar8 = *(Ssw_Cla_t **)(local_40 + 2);
          memset(pSVar8,0,(uVar21 & 0xffffffff) << 2);
        }
        local_40[1] = iVar3;
        local_64 = local_64 + 1;
        *(undefined4 *)(p->pFuncNodeHash + 4) = 0;
        uVar11 = 0xffffffff;
      }
      else {
        pSVar8 = p;
        Ssw_RarTransferPatterns((Ssw_RarMan_t *)p,*(Vec_Int_t **)&p->nCands1);
      }
      if (pPars->fVerbose == 0) {
        Abc_Print((int)pSVar8,".");
      }
      else {
        Abc_Print((int)pSVar8,"Round %3d:  ",(ulong)uVar11);
        pSVar8 = *(Ssw_Cla_t **)&p->fConstCorr;
        Ssw_ClassesPrint(pSVar8,0);
      }
      uVar11 = uVar11 + 1;
    }
LAB_005ed2ed:
    iVar3 = -1;
LAB_005ed330:
    if ((uVar11 == pPars->nRounds) && (iVar12 == pPars->nFrames)) {
      if (pPars->fVerbose == 0) {
        iVar12 = Abc_FrameIsBatchMode();
        pcVar14 = "\n";
        if (iVar12 == 0) {
          pcVar14 = "\r";
        }
        Abc_Print(iVar4,"%s",pcVar14);
      }
      Abc_Print(iVar4,
                "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ",
                (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_64 + uVar11));
      iVar4 = 3;
      iVar12 = clock_gettime(3,&local_60);
      if (iVar12 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      lVar20 = lVar20 - local_50;
      Abc_Print(iVar4,"%s =","Time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)lVar20 / 1000000.0);
    }
    Ssw_RarManStop((Ssw_RarMan_t *)p);
  }
  return iVar3;
}

Assistant:

int Ssw_RarSignalFilter( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    Ssw_RarMan_t * p;
    int r, f = -1, i, k;
    abctime clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    // consider the case of empty AIG
    if ( Aig_ManNodeNum(pAig) == 0 )
        return -1;
    // check trivially SAT miters
    if ( pPars->fMiter && Ssw_RarCheckTrivial( pAig, 1 ) )
        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    // compute starting state if needed
    assert( p->vInits == NULL );
    if ( pPars->pCex )
    {
        p->vInits = Ssw_RarFindStartingState( pAig, pPars->pCex );
        Abc_Print( 1, "Beginning simulation from the state derived using the counter-example.\n" );
    }
    else
        p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) );
    // duplicate the array
    for ( i = 1; i < pPars->nWords; i++ )
        for ( k = 0; k < Aig_ManRegNum(pAig); k++ )
            Vec_IntPush( p->vInits, Vec_IntEntry(p->vInits, k) );
    assert( Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords );

    // create trivial equivalence classes with all nodes being candidates for constant 1
    if ( pAig->pReprs == NULL )
        p->ppClasses = Ssw_ClassesPrepareSimple( pAig, pPars->fLatchOnly, 0 );
    else
        p->ppClasses = Ssw_ClassesPrepareFromReprs( pAig );
    Ssw_ClassesSetData( p->ppClasses, p, Ssw_RarManObjHashWord, Ssw_RarManObjIsConst, Ssw_RarManObjsAreEqual );
    // print the stats
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Initial  :  " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // refine classes using BMC
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        // start filtering equivalence classes
        if ( Ssw_ClassesCand1Num(p->ppClasses) == 0 && Ssw_ClassesClassNum(p->ppClasses) == 0 )
        {
            Abc_Print( 1, "All equivalences are refined away.\n" );
            break;
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 1, !r && !f );
            if ( pPars->fMiter && Ssw_RarManCheckNonConstOutputs(p, -1, 0) )
            {
                if ( !pPars->fVerbose )
                    Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
//                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * pPars->nFrames, (r+1) * pPars->nFrames );
                if ( pPars->fVerbose )
                    Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Ssw_RarManPrepareRandom( nSavedSeed );
                Abc_CexFree( pAig->pSeqModel );
                pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, 1 );
                // print final report
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                RetValue = 0;
                goto finish;
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                goto finish;
            }
        }
        // get initialization patterns
        if ( pPars->pCex == NULL && pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Round %3d:  ", r );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        else
        {
            Abc_Print( 1, "." );
        }
    }
finish:
    // report
    if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fVerbose )
            Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}